

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_make_transformation_rotationv3_EXP(matrix4 *self,vector3 *vR)

{
  matrix4 scratchMatrix;
  matrix4 local_50;
  
  (self->field_0).m[0] = 1.0;
  *(undefined8 *)((long)&self->field_0 + 4) = 0;
  *(undefined8 *)((long)&self->field_0 + 0xc) = 0;
  (self->field_0).m[5] = 1.0;
  *(undefined8 *)((long)&self->field_0 + 0x18) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x20) = 0;
  (self->field_0).m[10] = 1.0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  matrix4_set_from_euler_anglesf3_EXP
            (&local_50,(vR->field_0).v[0],(vR->field_0).v[1],(vR->field_0).v[2]);
  matrix4_multiply(self,&local_50);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationv3_EXP(struct matrix4 *self, const struct vector3 *vR)
{
	struct matrix4 scratchMatrix;

	matrix4_identity(self);

	return matrix4_multiply(self,
		matrix4_set_from_euler_anglesf3_EXP(&scratchMatrix, vR->x, vR->y, vR->z));
}